

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool get_separator(HttpProxyNegotiator *s,char sep)

{
  strbuf *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  psVar1 = s->header;
  uVar3 = s->header_pos;
  uVar2 = psVar1->len;
  uVar5 = uVar2;
  if (uVar2 < uVar3) {
    uVar5 = uVar3;
  }
  while (((uVar4 = uVar5, uVar3 < uVar2 && (uVar4 = uVar3, (ulong)(byte)psVar1->s[uVar3] < 0x21)) &&
         ((0x100000600U >> ((ulong)(byte)psVar1->s[uVar3] & 0x3f) & 1) != 0))) {
    uVar3 = uVar3 + 1;
  }
  if ((uVar4 != uVar2) && (psVar1->s[uVar4] == sep)) {
    s->header_pos = uVar4 + 1;
    return true;
  }
  return false;
}

Assistant:

static bool get_separator(HttpProxyNegotiator *s, char sep)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (s->header->s[pos] != sep)
        return false;

    s->header_pos = ++pos;
    return true;
}